

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# musashi_softfloat.c
# Opt level: O3

flag floatx80_le(floatx80 a,floatx80 b)

{
  ushort uVar1;
  ulong uVar2;
  ulong uVar3;
  ushort uVar4;
  bool bVar5;
  bool bVar6;
  
  uVar2 = b.low;
  uVar3 = a.low;
  if ((((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) != (undefined1  [16])0x0 &&
       (~a._0_4_ & 0x7fff) == 0) ||
     (((undefined1  [16])b & (undefined1  [16])0x7fffffffffffffff) != (undefined1  [16])0x0 &&
      (~b._0_4_ & 0x7fff) == 0)) {
    float_exception_flags = float_exception_flags | 1;
    return '\0';
  }
  uVar1 = b.high;
  uVar4 = a.high;
  if (-1 < (short)(uVar1 ^ uVar4)) {
    if ((short)uVar4 < 0) {
      bVar5 = uVar1 < uVar4;
      bVar6 = uVar2 < uVar3;
    }
    else {
      bVar5 = uVar4 < uVar1;
      bVar6 = uVar3 < uVar2;
    }
    return ((bVar6 || uVar3 == uVar2) && uVar4 == uVar1) | bVar5;
  }
  if (-1 < (short)uVar4) {
    return (((b._0_4_ | a._0_4_) * 2 & 0xffff) == 0 && uVar3 == 0) && uVar2 == 0;
  }
  return '\x01';
}

Assistant:

flag floatx80_le( floatx80 a, floatx80 b )
{
	flag aSign, bSign;

	if (    (    ( extractFloatx80Exp( a ) == 0x7FFF )
				&& (bits64) ( extractFloatx80Frac( a )<<1 ) )
			|| (    ( extractFloatx80Exp( b ) == 0x7FFF )
				&& (bits64) ( extractFloatx80Frac( b )<<1 ) )
		) {
		float_raise( float_flag_invalid );
		return 0;
	}
	aSign = extractFloatx80Sign( a );
	bSign = extractFloatx80Sign( b );
	if ( aSign != bSign ) {
		return
				aSign
			|| (    ( ( (bits16) ( ( a.high | b.high )<<1 ) ) | a.low | b.low )
					== 0 );
	}
	return
			aSign ? le128( b.high, b.low, a.high, a.low )
		: le128( a.high, a.low, b.high, b.low );

}